

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O2

Error __thiscall
asmjit::X86FuncArgsContext::markStackArgsReg(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Error EVar4;
  uint uVar5;
  uint uVar6;
  
  EVar4 = 0;
  if (this->_hasStackArgs == true) {
    if ((ffi->_attributes & 1) == 0) {
      bVar1 = ffi->_stackArgsRegId;
      uVar2 = this->_workData[0].usedRegs;
      if (bVar1 == 0xff) {
        uVar5 = this->_workData[0].workRegs;
        uVar6 = ~(this->_workData[0].dstRegs | uVar2) & uVar5;
        uVar2 = ~uVar2 & uVar5;
        if (uVar6 != 0) {
          uVar2 = uVar6;
        }
        uVar5 = ~uVar5 & this->_workData[0].archRegs;
        if (uVar2 != 0) {
          uVar5 = uVar2;
        }
        if (uVar5 != 0) {
          iVar3 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          ffi->_stackArgsRegId = (uint8_t)iVar3;
          return EVar4;
        }
        EVar4 = 0x35;
      }
      else {
        if (0x1f < bVar1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/../base/../base/../base/../base/utils.h"
                     ,0x13e,"x < 32");
        }
        if ((uVar2 >> (bVar1 & 0x1f) & 1) == 0) {
          return EVar4;
        }
        EVar4 = 0x37;
      }
      return EVar4;
    }
    ffi->_stackArgsRegId = '\x05';
  }
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markStackArgsReg(FuncFrameInfo& ffi) noexcept {
  if (!_hasStackArgs)
    return kErrorOk;

  // Decide which register to use to hold the stack base address.
  if (!ffi.hasPreservedFP()) {
    WorkData& wd = _workData[X86Reg::kKindGp];
    uint32_t saRegId = ffi.getStackArgsRegId();
    uint32_t usedRegs = wd.usedRegs;

    if (saRegId != Globals::kInvalidRegId) {
      // Check if the user chosen SA register doesn't overlap with others.
      // However, it's fine if it overlaps with some 'dstMove' register.
      if (usedRegs & Utils::mask(saRegId))
        return DebugUtils::errored(kErrorOverlappingStackRegWithRegArg);
    }
    else {
      // Initially, pick some clobbered or dirty register that is neither
      // in 'used' and neither in 'dstMove'. That's the safest bet as the
      // register won't collide with anything right now.
      uint32_t regs = wd.workRegs & ~(usedRegs | wd.dstRegs);

      // If that didn't work out pick some register which is not in 'used'.
      if (!regs) regs = wd.workRegs & ~usedRegs;

      // If that didn't work out then we have to make one more register dirty.
      if (!regs) regs = wd.archRegs & ~wd.workRegs;

      // If that didn't work out we can't continue.
      if (ASMJIT_UNLIKELY(!regs))
        return DebugUtils::errored(kErrorNoMorePhysRegs);

      saRegId = Utils::findFirstBit(regs);
      ffi.setStackArgsRegId(saRegId);
    }
  }
  else {
    ffi.setStackArgsRegId(X86Gp::kIdBp);
  }

  return kErrorOk;
}